

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

enable_if_t<std::is_base_of<interface_type,_std::decay_t<Impl1>_>::value,_void> __thiscall
poly::
vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::push_back<Impl1>(vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
                   *this,Impl1 *obj)

{
  elem_ptr_pointer pvVar1;
  ulong uVar2;
  long v_2;
  elem_ptr_pointer pvVar3;
  long v;
  elem_ptr_pointer pvVar4;
  long v_1;
  elem_ptr_pointer pvVar5;
  Impl1 *this_00;
  
  pvVar1 = this->_free_elem;
  pvVar3 = (elem_ptr_pointer)this->_begin_storage;
  if ((pvVar1 != pvVar3) && (uVar2 = this->_align_max, 7 < uVar2)) {
    pvVar4 = pvVar3;
    if (pvVar1 != (elem_ptr_pointer)
                  (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage) {
      pvVar4 = (elem_ptr_pointer)((long)pvVar1[-1].ptr.first + pvVar1[-1].sf.first);
    }
    if ((void_pointer)((long)pvVar4 + (uVar2 - ((long)pvVar4 + (uVar2 - 1)) % uVar2) + 0x2f) <=
        (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage) {
      if ((pvVar1 != pvVar3) && (uVar2 = this->_align_max, 7 < uVar2)) {
        pvVar4 = (elem_ptr_pointer)
                 (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
        pvVar5 = pvVar3;
        if (pvVar1 != pvVar4) {
          pvVar5 = (elem_ptr_pointer)((long)pvVar1[-1].ptr.first + pvVar1[-1].sf.first);
        }
        if ((void_pointer)((long)pvVar5 + (uVar2 - ((long)pvVar5 + (uVar2 - 1)) % uVar2) + 0x2f) <=
            (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage) {
          if (pvVar1 != pvVar4) {
            pvVar3 = (elem_ptr_pointer)((long)pvVar1[-1].ptr.first + pvVar1[-1].sf.first);
          }
          this_00 = (Impl1 *)(((uVar2 - 1) - ((uVar2 - 1) + (long)pvVar3) % uVar2) + (long)pvVar3);
          Impl1::Impl1(this_00,obj);
          pvVar1 = this->_free_elem;
          (pvVar1->
          super_CloningPolicyHolder<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::integral_constant<bool,_true>_>
          ).
          super_delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
          .cf = delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
                ::clone_func<Impl1>;
          (pvVar1->ptr).first = this_00;
          (pvVar1->ptr).second = (Interface *)this_00;
          (pvVar1->sf).first = 0x30;
          (pvVar1->sf).second = 8;
          this->_free_elem = this->_free_elem + 1;
          return;
        }
      }
      __assert_fail("can_construct_new_elem(s, a)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                    ,0x5a9,
                    "void poly::vector<Interface>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = std::allocator<Interface>, CloningPolicy = poly::delegate_cloning_policy<Interface>, T = Impl1, Args = <Impl1>]"
                   );
    }
  }
  vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
  ::push_back_new_elem_w_storage_increase<Impl1,Impl1>
            ((vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
              *)this);
  return;
}

Assistant:

inline auto vector<I, A, C>::push_back(T&& obj)
    -> std::enable_if_t<std::is_base_of<interface_type, std::decay_t<T>>::value>
{
    using TT         = std::decay_t<T>;
    constexpr auto s = sizeof(TT);
    constexpr auto a = alignof(TT);
    if (!can_construct_new_elem(s, a)) {
        push_back_new_elem_w_storage_increase(type_tag<TT> {}, std::forward<T>(obj));
    } else {
        push_back_new_elem(type_tag<TT> {}, std::forward<T>(obj));
    }
}